

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtablez_sampler.cc
# Opt level: O1

HashtablezInfo *
absl::lts_20240722::container_internal::SampleSlow
          (SamplingState *next_sample,size_t inline_element_size,size_t key_size,size_t value_size,
          uint16_t soo_capacity)

{
  bool bVar1;
  HashtablezSampler *this;
  HashtablezInfo *pHVar2;
  int64_t old_stride;
  uint16_t local_2a;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  int64_t local_10;
  
  if (_ZZN4absl12lts_2024072218container_internalL19ShouldForceSamplingEvE12global_state_0 != 0) {
    local_2a = soo_capacity;
    local_28 = value_size;
    local_20 = key_size;
    local_18 = inline_element_size;
    if (_ZZN4absl12lts_2024072218container_internalL19ShouldForceSamplingEvE12global_state_0 == 2) {
      bVar1 = AbslContainerInternalSampleEverything_lts_20240722();
      _ZZN4absl12lts_2024072218container_internalL19ShouldForceSamplingEvE12global_state_0 =
           (uint)bVar1;
    }
    if (_ZZN4absl12lts_2024072218container_internalL19ShouldForceSamplingEvE12global_state_0 == 1) {
      next_sample->next_sample = 1;
      local_10 = next_sample->sample_stride;
      next_sample->sample_stride = 1;
      this = GlobalHashtablezSampler();
      pHVar2 = profiling_internal::
               SampleRecorder<absl::lts_20240722::container_internal::HashtablezInfo>::
               Register<long_const&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_short&>
                         (this,&local_10,&local_18,&local_20,&local_28,&local_2a);
      return pHVar2;
    }
  }
  next_sample->next_sample = 0x7fffffffffffffff;
  next_sample->sample_stride = 0x7fffffffffffffff;
  return (HashtablezInfo *)0x0;
}

Assistant:

HashtablezInfo* SampleSlow(SamplingState& next_sample,
                           size_t inline_element_size, size_t key_size,
                           size_t value_size, uint16_t soo_capacity) {
  if (ABSL_PREDICT_FALSE(ShouldForceSampling())) {
    next_sample.next_sample = 1;
    const int64_t old_stride = exchange(next_sample.sample_stride, 1);
    HashtablezInfo* result = GlobalHashtablezSampler().Register(
        old_stride, inline_element_size, key_size, value_size, soo_capacity);
    return result;
  }

#if !defined(ABSL_INTERNAL_HASHTABLEZ_SAMPLE)
  next_sample = {
      std::numeric_limits<int64_t>::max(),
      std::numeric_limits<int64_t>::max(),
  };
  return nullptr;
#else
  bool first = next_sample.next_sample < 0;

  const int64_t next_stride = g_exponential_biased_generator.GetStride(
      g_hashtablez_sample_parameter.load(std::memory_order_relaxed));

  next_sample.next_sample = next_stride;
  const int64_t old_stride = exchange(next_sample.sample_stride, next_stride);
  // Small values of interval are equivalent to just sampling next time.
  ABSL_ASSERT(next_stride >= 1);

  // g_hashtablez_enabled can be dynamically flipped, we need to set a threshold
  // low enough that we will start sampling in a reasonable time, so we just use
  // the default sampling rate.
  if (!g_hashtablez_enabled.load(std::memory_order_relaxed)) return nullptr;

  // We will only be negative on our first count, so we should just retry in
  // that case.
  if (first) {
    if (ABSL_PREDICT_TRUE(--next_sample.next_sample > 0)) return nullptr;
    return SampleSlow(next_sample, inline_element_size, key_size, value_size,
                      soo_capacity);
  }

  return GlobalHashtablezSampler().Register(old_stride, inline_element_size,
                                            key_size, value_size, soo_capacity);
#endif
}